

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

void anon_unknown.dwarf_254993::fill5_16bit
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  int in_ECX;
  int in_EDX;
  Array2D<unsigned_short> *in_RSI;
  Array2D<unsigned_short> *in_RDI;
  int x;
  int y;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
      uVar1 = 0xffff;
      if ((local_20 + local_1c & 1U) != 0) {
        uVar1 = 0;
      }
      puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RSI,(long)local_1c);
      puVar2[local_20] = uVar1;
      puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,(long)local_1c);
      puVar2[local_20] = uVar1;
    }
  }
  return;
}

Assistant:

void
fill5_16bit (
    Array2D<unsigned short>& a, Array2D<unsigned short>& b, int nx, int ny)
{
    for (int y = 0; y < ny; ++y)
        for (int x = 0; x < nx; ++x)
            a[y][x] = b[y][x] = ((x + y) & 1) ? 0 : 0xffff;
}